

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::WriteProjectLine
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmGeneratorTarget *target,
          cmLocalGenerator *root,string *rootBinaryDir)

{
  cmLocalGenerator *this_00;
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  string message;
  undefined1 local_108 [8];
  string projFile;
  undefined1 local_c8 [8];
  string dir;
  cmLocalGenerator *lg;
  string local_98;
  char *local_78;
  char *projType;
  allocator<char> local_59;
  string local_58;
  char *local_38;
  char *projName;
  string *rootBinaryDir_local;
  cmLocalGenerator *root_local;
  cmGeneratorTarget *target_local;
  ostream *fout_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  projName = (char *)rootBinaryDir;
  rootBinaryDir_local = (string *)root;
  root_local = (cmLocalGenerator *)target;
  target_local = (cmGeneratorTarget *)fout;
  fout_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"GENERATOR_FILE_NAME",&local_59);
  pcVar2 = cmGeneratorTarget::GetProperty(target,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  this_00 = root_local;
  local_38 = pcVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"GENERATOR_FILE_NAME_EXT",(allocator<char> *)((long)&lg + 7));
  pcVar2 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)this_00,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&lg + 7));
  local_78 = pcVar2;
  if ((local_38 == (char *)0x0) || (pcVar2 == (char *)0x0)) {
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)root_local);
    std::operator+(&local_168,"The project file for target [",psVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   &local_168,"] is missing.\n");
    std::__cxx11::string::~string((string *)&local_168);
    cmSystemTools::Error((string *)local_148);
    poVar4 = std::operator<<((ostream *)target_local,"{comment} ");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)root_local);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    std::operator<<(poVar4," [missing project file]\n");
    std::__cxx11::string::~string((string *)local_148);
  }
  else {
    dir.field_2._8_8_ = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)root_local);
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       ((cmLocalGenerator *)dir.field_2._8_8_);
    std::__cxx11::string::string((string *)local_c8,(string *)psVar3);
    cmLocalGenerator::MaybeConvertToRelativePath
              ((string *)((long)&projFile.field_2 + 8),(cmLocalGenerator *)rootBinaryDir_local,
               (string *)projName,(string *)local_c8);
    std::__cxx11::string::operator=
              ((string *)local_c8,(string *)(projFile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(projFile.field_2._M_local_buf + 8));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c8,".");
    if (bVar1) {
      std::__cxx11::string::clear();
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::back();
      if (*pcVar2 != '/') {
        std::__cxx11::string::operator+=((string *)local_c8,"/");
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&message.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&message.field_2 + 8),FILE_EXTENSION);
    std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
    std::operator<<((ostream *)target_local,(string *)local_108);
    poVar4 = std::operator<<((ostream *)target_local," ");
    poVar4 = std::operator<<(poVar4,local_78);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)local_c8);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteProjectLine(
  std::ostream& fout, cmGeneratorTarget const* target, cmLocalGenerator* root,
  std::string& rootBinaryDir)
{
  const char* projName = target->GetProperty("GENERATOR_FILE_NAME");
  const char* projType = target->GetProperty("GENERATOR_FILE_NAME_EXT");
  if (projName && projType) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::string dir = lg->GetCurrentBinaryDirectory();
    dir = root->MaybeConvertToRelativePath(rootBinaryDir, dir);
    if (dir == ".") {
      dir.clear();
    } else {
      if (dir.back() != '/') {
        dir += "/";
      }
    }

    std::string projFile = dir + projName + FILE_EXTENSION;
    fout << projFile;
    fout << " " << projType << std::endl;
  } else {
    /* Should never happen */
    std::string message =
      "The project file for target [" + target->GetName() + "] is missing.\n";
    cmSystemTools::Error(message);
    fout << "{comment} " << target->GetName() << " [missing project file]\n";
  }
}